

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

Token * __thiscall Klex::getToken(Token *__return_storage_ptr__,Klex *this)

{
  unsigned_long uVar1;
  ulong uVar2;
  long lVar3;
  string local_40;
  unsigned_long local_20;
  unsigned_long col;
  Klex *this_local;
  
  local_20 = this->colNum;
  col = (unsigned_long)this;
  this_local = (Klex *)__return_storage_ptr__;
  uVar2 = std::__cxx11::string::length();
  if (uVar2 <= this->colNum) {
    uVar1 = this->colNum;
    lVar3 = std::__cxx11::string::length();
    local_20 = uVar1 - lVar3;
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&this->lexeme);
  Token::Token(__return_storage_ptr__,&local_40,this->tokenType,this->lineNum,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Token Klex::getToken() {
    unsigned long col = colNum;
    if(lexeme.length() <= colNum)
        col = colNum - lexeme.length();
    return Token(lexeme, tokenType, lineNum, col);
}